

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O0

TZEnumeration *
icu_63::TZEnumeration::create
          (USystemTimeZoneType type,char *region,int32_t *rawOffset,UErrorCode *ec)

{
  int32_t indexS;
  UBool UVar1;
  int iVar2;
  UErrorCode UVar3;
  int32_t *mapData;
  UResourceBundle *pUVar4;
  TimeZone *pTVar5;
  int32_t *piVar6;
  TZEnumeration *pTVar7;
  UResourceBundle *len;
  TZEnumeration *local_138;
  TZEnumeration *local_128;
  TZEnumeration *local_d8;
  TZEnumeration *result;
  int32_t *tmp;
  int32_t tzoffset;
  TimeZone *z;
  undefined1 local_a8 [8];
  char tzregion [4];
  UnicodeString id;
  int32_t zidx;
  int32_t i;
  UResourceBundle *res;
  int32_t filteredMapSize;
  int32_t numEntries;
  int32_t *filteredMap;
  int32_t *baseMap;
  UResourceBundle *pUStack_30;
  int32_t baseLen;
  UErrorCode *ec_local;
  int32_t *rawOffset_local;
  char *region_local;
  TZEnumeration *pTStack_10;
  USystemTimeZoneType type_local;
  
  pUStack_30 = (UResourceBundle *)ec;
  ec_local = rawOffset;
  rawOffset_local = (int32_t *)region;
  region_local._4_4_ = type;
  UVar1 = ::U_FAILURE(*ec);
  if (UVar1 == '\0') {
    len = (UResourceBundle *)((long)&baseMap + 4);
    mapData = getMap(region_local._4_4_,(int32_t *)len,(UErrorCode *)pUStack_30);
    UVar1 = ::U_FAILURE(*(UErrorCode *)&pUStack_30->fKey);
    if (UVar1 == '\0') {
      _filteredMapSize = (int32_t *)0x0;
      res._4_4_ = 0;
      if ((rawOffset_local != (int32_t *)0x0) || (ec_local != (UErrorCode *)0x0)) {
        res._0_4_ = 8;
        _filteredMapSize = (int32_t *)uprv_malloc_63(0x20);
        if (_filteredMapSize == (int32_t *)0x0) {
          *(undefined4 *)&pUStack_30->fKey = 7;
          return (TZEnumeration *)0x0;
        }
        pUVar4 = ures_openDirect_63((char *)0x0,"zoneinfo64",(UErrorCode *)pUStack_30);
        len = (UResourceBundle *)0x3ddf89;
        pUVar4 = ures_getByKey_63(pUVar4,"Names",pUVar4,(UErrorCode *)pUStack_30);
        for (id.fUnion._52_4_ = 0; (int)id.fUnion._52_4_ < baseMap._4_4_;
            id.fUnion._52_4_ = id.fUnion._52_4_ + 1) {
          indexS = mapData[(int)id.fUnion._52_4_];
          len = pUVar4;
          ures_getUnicodeStringByIndex
                    ((UnicodeString *)tzregion,pUVar4,indexS,(UErrorCode *)pUStack_30);
          UVar1 = ::U_FAILURE(*(UErrorCode *)&pUStack_30->fKey);
          if (UVar1 == '\0') {
            if (rawOffset_local == (int32_t *)0x0) {
LAB_002282a5:
              if (ec_local == (UErrorCode *)0x0) {
LAB_00228359:
                piVar6 = _filteredMapSize;
                if ((int)res <= (int)res._4_4_) {
                  res._0_4_ = (int)res + 8;
                  len = (UResourceBundle *)((long)(int)res << 2);
                  piVar6 = (int32_t *)uprv_realloc_63(_filteredMapSize,(size_t)len);
                  if (piVar6 == (int32_t *)0x0) {
                    *(undefined4 *)&pUStack_30->fKey = 7;
                    local_a8._4_4_ = 2;
                    goto LAB_002283e1;
                  }
                }
                _filteredMapSize = piVar6;
                len = (UResourceBundle *)(ulong)(res._4_4_ + 1);
                _filteredMapSize[(int)res._4_4_] = indexS;
                local_a8._4_4_ = 0;
                res._4_4_ = res._4_4_ + 1;
              }
              else {
                len = pUStack_30;
                pTVar5 = anon_unknown_17::createSystemTimeZone
                                   ((UnicodeString *)tzregion,(UErrorCode *)pUStack_30);
                UVar1 = ::U_FAILURE(*(UErrorCode *)&pUStack_30->fKey);
                if (UVar1 == '\0') {
                  UVar3 = (*(pTVar5->super_UObject)._vptr_UObject[8])();
                  if (pTVar5 != (TimeZone *)0x0) {
                    (*(pTVar5->super_UObject)._vptr_UObject[1])();
                  }
                  if (UVar3 == *ec_local) goto LAB_00228359;
                  local_a8._4_4_ = 4;
                }
                else {
                  local_a8._4_4_ = 2;
                }
              }
            }
            else {
              len = (UResourceBundle *)local_a8;
              TimeZone::getRegion((UnicodeString *)tzregion,(char *)len,4,(UErrorCode *)pUStack_30);
              UVar1 = ::U_FAILURE(*(UErrorCode *)&pUStack_30->fKey);
              if (UVar1 == '\0') {
                len = (UResourceBundle *)rawOffset_local;
                iVar2 = uprv_stricmp_63(local_a8,(char *)rawOffset_local);
                if (iVar2 == 0) goto LAB_002282a5;
                local_a8._4_4_ = 4;
              }
              else {
                local_a8._4_4_ = 2;
              }
            }
          }
          else {
            local_a8._4_4_ = 2;
          }
LAB_002283e1:
          UnicodeString::~UnicodeString((UnicodeString *)tzregion);
          if ((local_a8._4_4_ != 0) && (local_a8._4_4_ == 2)) break;
        }
        UVar1 = ::U_FAILURE(*(UErrorCode *)&pUStack_30->fKey);
        if (UVar1 != '\0') {
          uprv_free_63(_filteredMapSize);
          _filteredMapSize = (int32_t *)0x0;
        }
        ures_close_63(pUVar4);
      }
      local_d8 = (TZEnumeration *)0x0;
      UVar1 = ::U_SUCCESS(*(UErrorCode *)&pUStack_30->fKey);
      if (UVar1 != '\0') {
        if (_filteredMapSize == (int32_t *)0x0) {
          pTVar7 = (TZEnumeration *)UMemory::operator_new((UMemory *)0x90,(size_t)len);
          local_128 = (TZEnumeration *)0x0;
          if (pTVar7 != (TZEnumeration *)0x0) {
            TZEnumeration(pTVar7,mapData,baseMap._4_4_,'\0');
            local_128 = pTVar7;
          }
          local_d8 = local_128;
        }
        else {
          pTVar7 = (TZEnumeration *)UMemory::operator_new((UMemory *)0x90,(size_t)len);
          local_138 = (TZEnumeration *)0x0;
          if (pTVar7 != (TZEnumeration *)0x0) {
            TZEnumeration(pTVar7,_filteredMapSize,res._4_4_,'\x01');
            local_138 = pTVar7;
          }
          local_d8 = local_138;
          _filteredMapSize = (int32_t *)0x0;
        }
        if (local_d8 == (TZEnumeration *)0x0) {
          *(undefined4 *)&pUStack_30->fKey = 7;
        }
      }
      if (_filteredMapSize != (int32_t *)0x0) {
        uprv_free_63(_filteredMapSize);
      }
      pTStack_10 = local_d8;
    }
    else {
      pTStack_10 = (TZEnumeration *)0x0;
    }
  }
  else {
    pTStack_10 = (TZEnumeration *)0x0;
  }
  return pTStack_10;
}

Assistant:

static TZEnumeration* create(USystemTimeZoneType type, const char* region, const int32_t* rawOffset, UErrorCode& ec) {
        if (U_FAILURE(ec)) {
            return NULL;
        }

        int32_t baseLen;
        int32_t *baseMap = getMap(type, baseLen, ec);

        if (U_FAILURE(ec)) {
            return NULL;
        }

        // If any additional conditions are available,
        // create instance local map filtered by the conditions.

        int32_t *filteredMap = NULL;
        int32_t numEntries = 0;

        if (region != NULL || rawOffset != NULL) {
            int32_t filteredMapSize = DEFAULT_FILTERED_MAP_SIZE;
            filteredMap = (int32_t *)uprv_malloc(filteredMapSize * sizeof(int32_t));
            if (filteredMap == NULL) {
                ec = U_MEMORY_ALLOCATION_ERROR;
                return NULL;
            }

            // Walk through the base map
            UResourceBundle *res = ures_openDirect(0, kZONEINFO, &ec);
            res = ures_getByKey(res, kNAMES, res, &ec); // dereference Zones section
            for (int32_t i = 0; i < baseLen; i++) {
                int32_t zidx = baseMap[i];
                UnicodeString id = ures_getUnicodeStringByIndex(res, zidx, &ec);
                if (U_FAILURE(ec)) {
                    break;
                }
                if (region != NULL) {
                    // Filter by region
                    char tzregion[4]; // max 3 letters + null term
                    TimeZone::getRegion(id, tzregion, sizeof(tzregion), ec);
                    if (U_FAILURE(ec)) {
                        break;
                    }
                    if (uprv_stricmp(tzregion, region) != 0) {
                        // region does not match
                        continue;
                    }
                }
                if (rawOffset != NULL) {
                    // Filter by raw offset
                    // Note: This is VERY inefficient
                    TimeZone *z = createSystemTimeZone(id, ec);
                    if (U_FAILURE(ec)) {
                        break;
                    }
                    int32_t tzoffset = z->getRawOffset();
                    delete z;

                    if (tzoffset != *rawOffset) {
                        continue;
                    }
                }

                if (filteredMapSize <= numEntries) {
                    filteredMapSize += MAP_INCREMENT_SIZE;
                    int32_t *tmp = (int32_t *)uprv_realloc(filteredMap, filteredMapSize * sizeof(int32_t));
                    if (tmp == NULL) {
                        ec = U_MEMORY_ALLOCATION_ERROR;
                        break;
                    } else {
                        filteredMap = tmp;
                    }
                }

                filteredMap[numEntries++] = zidx;
            }

            if (U_FAILURE(ec)) {
                uprv_free(filteredMap);
                filteredMap = NULL;
            }

            ures_close(res);
        }

        TZEnumeration *result = NULL;
        if (U_SUCCESS(ec)) {
            // Finally, create a new enumeration instance
            if (filteredMap == NULL) {
                result = new TZEnumeration(baseMap, baseLen, FALSE);
            } else {
                result = new TZEnumeration(filteredMap, numEntries, TRUE);
                filteredMap = NULL;
            }
            if (result == NULL) {
                ec = U_MEMORY_ALLOCATION_ERROR;
            }
        }

        if (filteredMap != NULL) {
            uprv_free(filteredMap);
        }

        return result;
    }